

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O3

void __thiscall
helics::CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker>::commDisconnect
          (CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker> *this)

{
  bool bVar1;
  
  LOCK();
  bVar1 = (this->disconnectionStage).super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->disconnectionStage).super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (bVar1) {
    CommsInterface::disconnect
              ((CommsInterface *)
               (this->comms)._M_t.
               super___uniq_ptr_impl<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::tcp::TcpComms_*,_std::default_delete<helics::tcp::TcpComms>_>
               .super__Head_base<0UL,_helics::tcp::TcpComms_*,_false>._M_head_impl);
    LOCK();
    (this->disconnectionStage).super___atomic_base<int>._M_i = 2;
    UNLOCK();
  }
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::commDisconnect()
{
    int exp = 0;
    if (disconnectionStage.compare_exchange_strong(exp, 1)) {
        comms->disconnect();
        disconnectionStage = 2;
    }
}